

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_ClearAll(FAudio *audio)

{
  long in_RDI;
  FAudio_OPERATIONSET_Operation *next;
  FAudio_OPERATIONSET_Operation *current;
  FAudio_OPERATIONSET_Operation *pFree;
  FAudio_OPERATIONSET_Operation *op;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x135637);
  op = *(FAudio_OPERATIONSET_Operation **)(in_RDI + 0x78);
  while (op != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFree = op->next;
    DeleteOperation(op,(FAudioFreeFunc)pFree);
    op = pFree;
  }
  *(undefined8 *)(in_RDI + 0x78) = 0;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x135696);
  return;
}

Assistant:

void FAudio_OPERATIONSET_ClearAll(FAudio *audio)
{
	FAudio_OPERATIONSET_Operation *current, *next;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	current = audio->queuedOperations;
	while (current != NULL)
	{
		next = current->next;
		DeleteOperation(current, audio->pFree);
		current = next;
	}
	audio->queuedOperations = NULL;

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}